

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

optional<bool>
anon_unknown.dwarf_124e3dd::AdjustRPathELF
          (string *file,EmptyCallback *emptyCallback,AdjustCallback *adjustCallback,string *emsg,
          bool *changed)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  StringEntry *pSVar5;
  StringEntry *pSVar6;
  unsigned_long uVar7;
  long *plVar8;
  undefined1 *puVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  ulong uVar13;
  ushort uVar14;
  ulong uVar15;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmELF elf;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  outRPath;
  StringEntry *se [2];
  char *se_name [2];
  ofstream f;
  cmSystemToolsRPathInfo rp [2];
  undefined1 local_380 [40];
  bool *local_358;
  string *local_350;
  ulong local_348;
  undefined1 local_340 [32];
  char local_320;
  StringEntry *local_318 [2];
  char *local_308 [2];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [8];
  char *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  size_t local_2c0;
  StringEntry *local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined8 local_298;
  ios_base local_1e0 [264];
  unsigned_long local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  string local_a8 [8];
  ulong local_a0 [11];
  long local_48 [3];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar4 = 0xa0;
  puVar9 = local_c8 + 0x10;
  do {
    *(undefined1 **)(puVar9 + -0x10) = puVar9;
    *(undefined8 *)(puVar9 + -8) = 0;
    *puVar9 = 0;
    *(undefined1 **)(puVar9 + 0x10) = puVar9 + 0x20;
    *(undefined8 *)(puVar9 + 0x18) = 0;
    puVar9[0x20] = 0;
    puVar9 = puVar9 + 0x50;
    lVar4 = lVar4 + -0x50;
  } while (lVar4 != 0);
  cmELF::cmELF((cmELF *)local_380,(file->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid((cmELF *)local_380);
  if (!bVar2) {
    cmELF::~cmELF((cmELF *)local_380);
    uVar12 = 0;
    uVar14 = 0;
    goto LAB_003c86c9;
  }
  local_318[0] = (StringEntry *)0x0;
  local_318[1] = (StringEntry *)0x0;
  local_308[0] = (char *)0x0;
  local_308[1] = (char *)0x0;
  pSVar5 = cmELF::GetRPath((cmELF *)local_380);
  if (pSVar5 != (StringEntry *)0x0) {
    local_308[0] = "RPATH";
    local_318[0] = pSVar5;
  }
  uVar10 = (uint)(pSVar5 != (StringEntry *)0x0);
  pSVar6 = cmELF::GetRunPath((cmELF *)local_380);
  if (pSVar6 == (StringEntry *)0x0) {
    local_348 = 1;
    if (pSVar5 != (StringEntry *)0x0) goto LAB_003c834d;
    local_2d8 = (undefined1  [8])emsg;
    if ((emptyCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar2 = (*emptyCallback->_M_invoker)
                      ((_Any_data *)emptyCallback,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       local_2d8,(cmELF *)local_380);
    uVar12 = (ushort)bVar2;
    cmELF::~cmELF((cmELF *)local_380);
  }
  else {
    uVar15 = (ulong)(uVar10 * 8);
    *(StringEntry **)((long)local_318 + uVar15) = pSVar6;
    *(char **)((long)local_318 + uVar15 + 0x10) = "RUNPATH";
    local_348 = (ulong)(uVar10 + 1);
LAB_003c834d:
    bVar2 = true;
    uVar15 = 0;
    uVar10 = 0;
    local_358 = changed;
    local_350 = file;
    do {
      if (uVar10 == 0) {
        pSVar5 = local_318[uVar15];
        uVar7 = pSVar5->Position;
LAB_003c8392:
        lVar4 = (long)(int)uVar10;
        lVar11 = lVar4 * 0x50;
        local_d8[lVar4 * 10] = uVar7;
        local_d8[lVar4 * 10 + 1] = pSVar5->Size;
        pSVar6 = local_318[uVar15 + 2];
        pcVar1 = *(char **)(local_a8 + lVar11 + -0x18);
        strlen((char *)pSVar6);
        std::__cxx11::string::_M_replace((ulong)(local_c8 + lVar11),0,pcVar1,(ulong)pSVar6);
        local_320 = '\0';
        local_2f8._0_8_ = emsg;
        local_2d8 = (undefined1  [8])pSVar6;
        if ((adjustCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar3 = (*adjustCallback->_M_invoker)
                          ((_Any_data *)adjustCallback,
                           (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                 *)local_340)->_M_value,&pSVar5->Value,(char **)local_2d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           local_2f8);
        if (bVar3) {
          bVar3 = true;
          if (local_320 == '\x01') {
            bVar2 = (bool)(bVar2 & local_340._8_8_ == 0);
            if (local_d8[lVar4 * 10 + 1] < local_340._8_8_ + 1) {
              if (emsg != (string *)0x0) {
                local_2d8 = (undefined1  [8])0x29;
                local_2d0 = "The replacement path is too long for the ";
                local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                local_2c0 = strlen((char *)pSVar6);
                local_2b0 = 0;
                local_2a8 = 7;
                local_2a0 = " entry.";
                local_298 = 0;
                views._M_len = 3;
                views._M_array = (iterator)local_2d8;
                local_2b8 = pSVar6;
                cmCatViews((string *)local_2f8,views);
                std::__cxx11::string::operator=((string *)emsg,(string *)local_2f8);
                if ((string *)local_2f8._0_8_ != (string *)(local_2f8 + 0x10)) {
                  operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
                }
              }
              bVar3 = false;
            }
            else {
              std::__cxx11::string::operator=
                        (local_a8 + lVar11,
                         (string *)
                         &((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            *)local_340)->_M_value);
              uVar10 = uVar10 + 1;
            }
          }
          else {
            bVar2 = false;
          }
        }
        else {
          bVar3 = false;
        }
        if ((local_320 == '\x01') &&
           (local_320 = '\0',
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_340._0_8_ !=
           &(((_Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)local_340)->_M_value).field_2)) {
          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
        }
        if (!bVar3) {
          cmELF::~cmELF((cmELF *)local_380);
          goto LAB_003c8688;
        }
      }
      else {
        pSVar5 = local_318[uVar15];
        uVar7 = pSVar5->Position;
        if (local_d8[0] != uVar7) goto LAB_003c8392;
      }
      uVar15 = uVar15 + 1;
    } while (local_348 != uVar15);
    cmELF::~cmELF((cmELF *)local_380);
    uVar14 = 0x100;
    uVar12 = 1;
    if (uVar10 == 0) goto LAB_003c86c9;
    if (bVar2) {
      bVar2 = cmSystemTools::RemoveRPath(local_350,emsg,local_358);
      uVar12 = (ushort)bVar2;
      goto LAB_003c86c9;
    }
    std::ofstream::ofstream(local_2d8,(local_350->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
    if ((*(byte *)((long)&local_2b8 + ((StringEntry *)((long)local_2d8 + -0x38))->Position) & 5) !=
        0) {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x92713a);
      }
      local_2d8 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _EVP_PKEY_get_bn_param;
      std::filebuf::~filebuf((filebuf *)&local_2d0);
      std::ios_base::~ios_base(local_1e0);
LAB_003c8688:
      uVar14 = 0x100;
      uVar12 = 0;
      goto LAB_003c86c9;
    }
    if (0 < (int)uVar10) {
      uVar15 = 0;
      do {
        lVar4 = uVar15 * 0x50;
        plVar8 = (long *)std::ostream::seekp((ostream *)local_2d8,local_d8[uVar15 * 10],0);
        if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
          if (emsg != (string *)0x0) {
            cmStrCat<char_const(&)[18],std::__cxx11::string&,char_const(&)[11]>
                      ((string *)local_380,(char (*) [18])"Error seeking to ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_c8 + lVar4),(char (*) [11])0x927292);
LAB_003c887c:
            std::__cxx11::string::operator=((string *)emsg,(string *)local_380);
            if ((undefined1 *)CONCAT71(local_380._1_7_,local_380[0]) != local_380 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_380._1_7_,local_380[0]),
                              local_380._16_8_ + 1);
            }
          }
LAB_003c88a8:
          local_2d8 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _EVP_PKEY_get_bn_param;
          std::filebuf::~filebuf((filebuf *)&local_2d0);
          std::ios_base::~ios_base(local_1e0);
          uVar12 = 0;
          goto LAB_003c86c4;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2d8,*(char **)(local_a8 + lVar4),local_a0[uVar15 * 10]);
        for (uVar13 = local_a0[uVar15 * 10]; uVar13 < local_d8[uVar15 * 10 + 1]; uVar13 = uVar13 + 1
            ) {
          local_380[0] = (string)0x0;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,local_380,1);
        }
        if ((*(byte *)((long)&local_2b8 + ((StringEntry *)((long)local_2d8 + -0x38))->Position) & 5)
            != 0) {
          if (emsg != (string *)0x0) {
            cmStrCat<char_const(&)[23],std::__cxx11::string&,char_const(&)[21]>
                      ((string *)local_380,(char (*) [23])"Error writing the new ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_c8 + lVar4),(char (*) [21])0x9272ba);
            goto LAB_003c887c;
          }
          goto LAB_003c88a8;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar10);
    }
    local_2d8 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_2d8 + _VTT[-1].Position) = _EVP_PKEY_get_bn_param;
    std::filebuf::~filebuf((filebuf *)&local_2d0);
    std::ios_base::~ios_base(local_1e0);
    uVar12 = 1;
    if (local_358 != (bool *)0x0) {
      *local_358 = true;
    }
  }
LAB_003c86c4:
  uVar14 = 0x100;
LAB_003c86c9:
  lVar4 = -0xa0;
  plVar8 = local_48;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    if (plVar8 + -4 != (long *)plVar8[-6]) {
      operator_delete((long *)plVar8[-6],plVar8[-4] + 1);
    }
    plVar8 = plVar8 + -10;
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0);
  return (_Optional_base<bool,_true,_true>)(uVar14 | uVar12);
}

Assistant:

cm::optional<bool> AdjustRPathELF(std::string const& file,
                                  const EmptyCallback& emptyCallback,
                                  const AdjustCallback& adjustCallback,
                                  std::string* emsg, bool* changed)
{
  if (changed) {
    *changed = false;
  }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());
    if (!elf) {
      return cm::nullopt; // Not a valid ELF file.
    }

    // Get the RPATH and RUNPATH entries from it.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { nullptr, nullptr };
    const char* se_name[2] = { nullptr, nullptr };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count] = se_rpath;
      se_name[se_count] = "RPATH";
      ++se_count;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count] = se_runpath;
      se_name[se_count] = "RUNPATH";
      ++se_count;
    }
    if (se_count == 0) {
      return emptyCallback(emsg, elf);
    }

    for (int i = 0; i < se_count; ++i) {
      // If both RPATH and RUNPATH refer to the same string literal it
      // needs to be changed only once.
      if (rp_count && rp[0].Position == se[i]->Position) {
        continue;
      }

      // Store information about the entry in the file.
      rp[rp_count].Position = se[i]->Position;
      rp[rp_count].Size = se[i]->Size;
      rp[rp_count].Name = se_name[i];

      // Adjust the rpath.
      cm::optional<std::string> outRPath;
      if (!adjustCallback(outRPath, se[i]->Value, se_name[i], emsg)) {
        return false;
      }

      if (outRPath) {
        if (!outRPath->empty()) {
          remove_rpath = false;
        }

        // Make sure there is enough room to store the new rpath and at
        // least one null terminator.
        if (rp[rp_count].Size < outRPath->length() + 1) {
          if (emsg) {
            *emsg = cmStrCat("The replacement path is too long for the ",
                             se_name[i], " entry.");
          }
          return false;
        }

        // This entry is ready for update.
        rp[rp_count].Value = std::move(*outRPath);
        ++rp_count;
      } else {
        remove_rpath = false;
      }
    }
  }

  // If no runtime path needs to be changed, we are done.
  if (rp_count == 0) {
    return true;
  }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath) {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
  }

  {
    // Open the file for update.
    cmsys::ofstream f(file.c_str(),
                      std::ios::in | std::ios::out | std::ios::binary);
    if (!f) {
      if (emsg) {
        *emsg = "Error opening file for update.";
      }
      return false;
    }

    // Store the new RPATH and RUNPATH strings.
    for (int i = 0; i < rp_count; ++i) {
      // Seek to the RPATH position.
      if (!f.seekp(rp[i].Position)) {
        if (emsg) {
          *emsg = cmStrCat("Error seeking to ", rp[i].Name, " position.");
        }
        return false;
      }

      // Write the new rpath.  Follow it with enough null terminators to
      // fill the string table entry.
      f << rp[i].Value;
      for (unsigned long j = rp[i].Value.length(); j < rp[i].Size; ++j) {
        f << '\0';
      }

      // Make sure it wrote correctly.
      if (!f) {
        if (emsg) {
          *emsg = cmStrCat("Error writing the new ", rp[i].Name,
                           " string to the file.");
        }
        return false;
      }
    }
  }

  // Everything was updated successfully.
  if (changed) {
    *changed = true;
  }
  return true;
}